

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_TestParamSet.c
# Opt level: O1

void fiat_id_GostR3410_2001_TestParamSet_from_montgomery(uint64_t *out1,uint64_t *arg1)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  
  uVar1 = *arg1;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar1 * -0x2406ae2a77c4d4d1;
  uVar6 = SUB168(auVar2 * ZEXT816(0x431),8);
  uVar12 = (ulong)CARRY8(SUB168(auVar2 * ZEXT816(0x431),0),uVar1);
  uVar11 = uVar6 + arg1[1];
  uVar9 = uVar11 + uVar12;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar9 * -0x2406ae2a77c4d4d1;
  uVar12 = (ulong)CARRY8(SUB168(auVar3 * ZEXT816(0x431),0),uVar9) +
           SUB168(auVar3 * ZEXT816(0x431),8) +
           (ulong)(CARRY8(uVar6,arg1[1]) || CARRY8(uVar11,uVar12));
  uVar10 = uVar9 << 0x3f | uVar1 * -0x2406ae2a77c4d4d1 >> 1;
  uVar13 = uVar12 + arg1[2];
  uVar12 = (ulong)CARRY8(uVar12,arg1[2]);
  uVar11 = (uVar1 << 0x3f) + arg1[3];
  uVar8 = uVar11 + uVar12;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar13 * -0x2406ae2a77c4d4d1;
  uVar7 = SUB168(auVar4 * ZEXT816(0x431),8);
  uVar6 = uVar9 * -0x2406ae2a77c4d4d1 >> 1 | uVar13 << 0x3f;
  uVar9 = uVar7 + uVar8;
  uVar11 = (ulong)(CARRY8(uVar1 << 0x3f,arg1[3]) || CARRY8(uVar11,uVar12)) +
           (ulong)CARRY8(uVar7,uVar8);
  uVar1 = (ulong)CARRY8(SUB168(auVar4 * ZEXT816(0x431),0),uVar13);
  uVar8 = uVar9 + uVar1;
  uVar1 = (ulong)CARRY8(uVar9,uVar1);
  uVar12 = uVar11 + uVar10;
  uVar9 = uVar12 + uVar1;
  uVar1 = (ulong)(CARRY8(uVar11,uVar10) || CARRY8(uVar12,uVar1));
  uVar11 = uVar6 + uVar1;
  uVar10 = (uVar13 * -0x2406ae2a77c4d4d1 >> 1) + (ulong)CARRY8(uVar6,uVar1);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar8 * -0x2406ae2a77c4d4d1;
  uVar6 = SUB168(auVar5 * ZEXT816(0x431),8);
  uVar1 = (ulong)CARRY8(SUB168(auVar5 * ZEXT816(0x431),0),uVar8);
  uVar12 = uVar6 + uVar9;
  uVar7 = uVar12 + uVar1;
  uVar1 = (ulong)(CARRY8(uVar6,uVar9) || CARRY8(uVar12,uVar1));
  uVar6 = uVar11 + uVar1;
  uVar1 = (ulong)CARRY8(uVar11,uVar1);
  uVar12 = (uVar8 << 0x3f) + uVar10;
  uVar9 = uVar12 + uVar1;
  uVar8 = (uVar8 * -0x2406ae2a77c4d4d1 >> 1) +
          (ulong)(CARRY8(uVar8 << 0x3f,uVar10) || CARRY8(uVar12,uVar1));
  uVar10 = (ulong)(byte)-((0x430 < uVar7) + -1);
  uVar11 = (ulong)(uVar6 < uVar10);
  uVar13 = (ulong)(uVar9 < uVar11) | 0x8000000000000000;
  uVar1 = -(ulong)(uVar8 < uVar13);
  uVar12 = ~uVar1;
  *out1 = uVar7 - 0x431 & uVar12 | uVar7 & uVar1;
  out1[1] = uVar6 - uVar10 & uVar12 | uVar6 & uVar1;
  out1[2] = uVar9 - uVar11 & uVar12 | uVar9 & uVar1;
  out1[3] = uVar12 & uVar8 - uVar13 | uVar1 & uVar8;
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_TestParamSet_from_montgomery(
    uint64_t out1[4], const uint64_t arg1[4]) {
    uint64_t x1;
    uint64_t x2;
    uint64_t x3;
    uint64_t x4;
    uint64_t x5;
    uint64_t x6;
    uint64_t x7;
    uint64_t x8;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x9;
    uint64_t x10;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x11;
    uint64_t x12;
    uint64_t x13;
    uint64_t x14;
    uint64_t x15;
    uint64_t x16;
    uint64_t x17;
    uint64_t x18;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x19;
    uint64_t x20;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x21;
    uint64_t x22;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x23;
    uint64_t x24;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x25;
    uint64_t x26;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x27;
    uint64_t x28;
    uint64_t x29;
    uint64_t x30;
    uint64_t x31;
    uint64_t x32;
    uint64_t x33;
    uint64_t x34;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x35;
    uint64_t x36;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x37;
    uint64_t x38;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x39;
    uint64_t x40;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x41;
    uint64_t x42;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x43;
    uint64_t x44;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x45;
    uint64_t x46;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x47;
    uint64_t x48;
    uint64_t x49;
    uint64_t x50;
    uint64_t x51;
    uint64_t x52;
    uint64_t x53;
    uint64_t x54;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x55;
    uint64_t x56;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x57;
    uint64_t x58;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x59;
    uint64_t x60;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x61;
    uint64_t x62;
    uint64_t x63;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x64;
    uint64_t x65;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x66;
    uint64_t x67;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x68;
    uint64_t x69;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x70;
    uint64_t x71;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x72;
    uint64_t x73;
    uint64_t x74;
    uint64_t x75;
    uint64_t x76;
    x1 = (arg1[0]);
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x2, &x3, x1,
                                                 UINT64_C(0xdbf951d5883b2b2f));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x4, &x5, x2,
                                                 UINT64_C(0x8000000000000000));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x6, &x7, x2, UINT16_C(0x431));
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x8, &x9, 0x0, x1, x6);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x10, &x11, 0x0,
                                                      (x9 + x7), (arg1[1]));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x12, &x13, x10,
                                                 UINT64_C(0xdbf951d5883b2b2f));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x14, &x15, x12,
                                                 UINT64_C(0x8000000000000000));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x16, &x17, x12,
                                                 UINT16_C(0x431));
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x18, &x19, 0x0, x5, x14);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x20, &x21, 0x0, x10,
                                                      x16);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(
        &x22, &x23, 0x0, (((uint64_t)x21 + x11) + x17), (arg1[2]));
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x24, &x25, x23, x4, 0x0);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x26, &x27, x25, x18,
                                                      0x0);
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x28, &x29, x22,
                                                 UINT64_C(0xdbf951d5883b2b2f));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x30, &x31, x28,
                                                 UINT64_C(0x8000000000000000));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x32, &x33, x28,
                                                 UINT16_C(0x431));
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x34, &x35, 0x0, x22,
                                                      x32);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x36, &x37, x35, x24,
                                                      x33);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x38, &x39, x37, x26,
                                                      0x0);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x40, &x41, x39,
                                                      (x27 + (x19 + x15)), x30);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x42, &x43, 0x0, x36,
                                                      (arg1[3]));
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x44, &x45, x43, x38,
                                                      0x0);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x46, &x47, x45, x40,
                                                      0x0);
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x48, &x49, x42,
                                                 UINT64_C(0xdbf951d5883b2b2f));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x50, &x51, x48,
                                                 UINT64_C(0x8000000000000000));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x52, &x53, x48,
                                                 UINT16_C(0x431));
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x54, &x55, 0x0, x42,
                                                      x52);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x56, &x57, x55, x44,
                                                      x53);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x58, &x59, x57, x46,
                                                      0x0);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x60, &x61, x59,
                                                      (x47 + (x41 + x31)), x50);
    x62 = (x61 + x51);
    fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&x63, &x64, 0x0, x56,
                                                       UINT16_C(0x431));
    fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&x65, &x66, x64, x58,
                                                       0x0);
    fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&x67, &x68, x66, x60,
                                                       0x0);
    fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(
        &x69, &x70, x68, x62, UINT64_C(0x8000000000000000));
    fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&x71, &x72, x70, 0x0,
                                                       0x0);
    fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64(&x73, x72, x63, x56);
    fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64(&x74, x72, x65, x58);
    fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64(&x75, x72, x67, x60);
    fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64(&x76, x72, x69, x62);
    out1[0] = x73;
    out1[1] = x74;
    out1[2] = x75;
    out1[3] = x76;
}